

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O3

void __thiscall Imf_2_5::Attribute::unRegisterAttributeType(Attribute *this,char *typeName)

{
  _Base_ptr this_00;
  int iVar1;
  uint uVar2;
  _Rb_tree_node_base *p_Var3;
  void *pvVar4;
  long lVar5;
  _Base_ptr p_Var6;
  _Link_type p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Self __tmp;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  
  anon_unknown_0::typeMap();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  this_00 = anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header
            ._M_parent;
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent == (_Base_ptr)0x0) {
    if ((_Rb_tree_header *)
        anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left == &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header)
    {
LAB_0048e518:
      std::
      _Rb_tree<const_char_*,_std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>,_std::_Select1st<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
      ::_M_erase((_Rb_tree<const_char_*,_std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>,_std::_Select1st<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                  *)this_00,(_Link_type)typeName);
      anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
      anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                  _M_header;
      anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
    }
LAB_0048e585:
    pthread_mutex_unlock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
    return;
  }
  p_Var8 = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header
  ;
  p_Var3 = anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
LAB_0048e45d:
  typeName = *(char **)(p_Var3 + 1);
  p_Var7 = (_Link_type)this;
  iVar1 = strcmp(typeName,(char *)this);
  lVar5 = 0x18;
  p_Var10 = p_Var8;
  if (iVar1 < 0) goto LAB_0048e491;
  iVar1 = strcmp((char *)this,typeName);
  lVar5 = 0x10;
  p_Var7 = (_Link_type)typeName;
  p_Var10 = p_Var3;
  if (iVar1 < 0) goto LAB_0048e491;
  p_Var9 = p_Var3->_M_right;
  for (p_Var6 = p_Var3->_M_left; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[uVar2 >> 0x1f]) {
    typeName = (char *)this;
    uVar2 = strcmp(*(char **)(p_Var6 + 1),(char *)this);
    if (-1 < (int)uVar2) {
      p_Var3 = p_Var6;
    }
  }
  for (; p_Var10 = p_Var3, p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[~uVar2 >> 0x1f]) {
    typeName = *(char **)(p_Var9 + 1);
    uVar2 = strcmp((char *)this,typeName);
    if ((int)uVar2 < 0) {
      p_Var8 = p_Var9;
    }
  }
LAB_0048e503:
  if ((anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left != p_Var10) ||
     ((_Rb_tree_header *)p_Var8 !=
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header)) {
    while (p_Var10 != p_Var8) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      pvVar4 = (void *)std::_Rb_tree_rebalance_for_erase
                                 (p_Var10,&anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.
                                           super__Rb_tree_header._M_header);
      operator_delete(pvVar4,0x30);
      anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
           anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
           _M_node_count - 1;
      p_Var10 = p_Var3;
    }
    goto LAB_0048e585;
  }
  goto LAB_0048e518;
LAB_0048e491:
  p_Var8 = p_Var10;
  typeName = (char *)p_Var7;
  p_Var3 = *(_Rb_tree_node_base **)
            ((long)&((_Rb_tree_node_base *)&p_Var3->_M_color)->_M_color + lVar5);
  p_Var10 = p_Var8;
  if (p_Var3 == (_Rb_tree_node_base *)0x0) goto LAB_0048e503;
  goto LAB_0048e45d;
}

Assistant:

void
Attribute::unRegisterAttributeType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    tMap.erase (typeName);
}